

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.2.4.11.h
# Opt level: O0

String * doctest::toString<float>(IsNaN<float> in)

{
  String *in_RDI;
  float in_stack_ffffffffffffff3c;
  String *in_00;
  String *in_stack_ffffffffffffff50;
  String *in_stack_ffffffffffffff80;
  String *in_stack_ffffffffffffff88;
  
  in_00 = in_RDI;
  String::String(in_stack_ffffffffffffff50,(char *)in_RDI);
  String::String(in_stack_ffffffffffffff50,(char *)in_00);
  operator+(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  toString(in_stack_ffffffffffffff3c);
  operator+(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  String::String(in_stack_ffffffffffffff50,(char *)in_00);
  operator+(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  String::~String(in_RDI);
  String::~String(in_RDI);
  String::~String(in_RDI);
  String::~String(in_RDI);
  String::~String(in_RDI);
  String::~String(in_RDI);
  return in_00;
}

Assistant:

String toString(IsNaN<F> in) { return String(in.flipped ? "! " : "") + "IsNaN( " + doctest::toString(in.value) + " )"; }